

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnFunction(SharedValidator *this,Location *loc,Var *sig_var)

{
  Var local_b0;
  Enum local_64;
  undefined1 local_60 [8];
  FuncType type;
  Var *sig_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  type._48_8_ = sig_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  FuncType::FuncType((FuncType *)local_60);
  Var::Var(&local_b0,sig_var);
  local_64 = (Enum)CheckFuncTypeIndex(this,&local_b0,(FuncType *)local_60);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_64);
  Var::~Var(&local_b0);
  std::vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>::
  push_back(&this->funcs_,(value_type *)local_60);
  FuncType::~FuncType((FuncType *)local_60);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnFunction(const Location& loc, Var sig_var) {
  Result result = Result::Ok;
  FuncType type;
  result |= CheckFuncTypeIndex(sig_var, &type);
  funcs_.push_back(type);
  return result;
}